

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

void * __thiscall
kj::anon_unknown_35::InMemoryFile::mmap
          (InMemoryFile *this,void *__addr,size_t __len,int __prot,int __flags,int __fd,
          __off_t __offset)

{
  undefined8 *puVar1;
  undefined4 in_register_0000000c;
  _func_int **pp_Var2;
  Fault f;
  Fault local_38;
  
  pp_Var2 = (_func_int **)CONCAT44(in_register_0000000c,__prot);
  if (!CARRY8((ulong)pp_Var2,__len)) {
    kj::_::Mutex::lock((Mutex *)((long)__addr + 0x18),EXCLUSIVE);
    Impl::ensureCapacity((Impl *)((long)__addr + 0x30),(long)pp_Var2 + __len);
    puVar1 = (undefined8 *)operator_new(0x18);
    LOCK();
    *(int *)((long)__addr + 0x10) = *(int *)((long)__addr + 0x10) + 1;
    UNLOCK();
    *puVar1 = &PTR_disposeImpl_002c2010;
    puVar1[1] = (long)__addr + 8;
    puVar1[2] = __addr;
    *(int *)((long)__addr + 0x60) = *(int *)((long)__addr + 0x60) + 1;
    (this->super_File).super_ReadableFile.super_FsNode._vptr_FsNode =
         (_func_int **)(__len + *(long *)((long)__addr + 0x38));
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = pp_Var2;
    *(undefined8 **)&(this->super_AtomicRefcounted).refcount = puVar1;
    kj::_::Mutex::unlock((Mutex *)((long)__addr + 0x18),EXCLUSIVE);
    return this;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
            (&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x328,FAILED,"offset + size >= offset","\"mmap() request overflows uint64\"",
             (char (*) [32])"mmap() request overflows uint64");
  kj::_::Debug::Fault::fatal(&local_38);
}

Assistant:

Array<const byte> mmap(uint64_t offset, uint64_t size) const override {
    KJ_REQUIRE(offset + size >= offset, "mmap() request overflows uint64");
    auto lock = impl.lockExclusive();
    lock->ensureCapacity(offset + size);

    ArrayDisposer* disposer = new MmapDisposer(atomicAddRef(*this));
    return Array<const byte>(lock->bytes.begin() + offset, size, *disposer);
  }